

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O0

void __thiscall
Arcflow::lift_state(Arcflow *this,vector<int,_std::allocator<int>_> *valid_opts,
                   vector<int,_std::allocator<int>_> *u,int it,int ic)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  const_reference pvVar4;
  reference pvVar5;
  int *piVar6;
  reference piVar7;
  const_reference pvVar8;
  size_type sVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_120;
  const_iterator local_118;
  int *local_110;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_108;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_100;
  const_iterator local_f8;
  int *local_f0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_e8;
  int local_e0;
  int local_dc;
  const_iterator cStack_d8;
  int t_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  vector<int,_std::allocator<int>_> caps;
  int local_a0;
  int i;
  int maxpos;
  int t;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int minw;
  int d_1;
  vector<int,_std::allocator<int>_> *local_60;
  vector<int,_std::allocator<int>_> *r;
  int d;
  allocator<int> local_41;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> space;
  int ic_local;
  int it_local;
  vector<int,_std::allocator<int>_> *u_local;
  vector<int,_std::allocator<int>_> *valid_opts_local;
  Arcflow *this_local;
  
  if (it < (this->inst).nsizes) {
    iVar3 = (this->inst).ndims;
    space.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = ic;
    space.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = it;
    std::allocator<int>::allocator(&local_41);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_40,(long)iVar3,&local_41);
    std::allocator<int>::~allocator(&local_41);
    for (r._0_4_ = 0; (int)r < (this->inst).ndims; r._0_4_ = (int)r + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->maxW,(long)(int)r);
      iVar3 = *pvVar4;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](u,(long)(int)r);
      iVar1 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_40,(long)(int)r);
      *pvVar5 = iVar3 - iVar1;
    }
    count_max_rep((vector<int,_std::allocator<int>_> *)&minw,this,
                  (vector<int,_std::allocator<int>_> *)local_40,
                  space.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_,
                  (int)space.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    local_60 = (vector<int,_std::allocator<int>_> *)&minw;
    for (__range2._4_4_ = 0; __range2._4_4_ < (this->inst).ndims;
        __range2._4_4_ = __range2._4_4_ + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->maxW,(long)__range2._4_4_);
      __range2._0_4_ = *pvVar4;
      __end2 = std::vector<int,_std::allocator<int>_>::begin(valid_opts);
      _maxpos = std::vector<int,_std::allocator<int>_>::end(valid_opts);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                         *)&maxpos), bVar2) {
        piVar7 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&__end2);
        pvVar8 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&(this->inst).Ws,(long)*piVar7);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)__range2._4_4_);
        piVar6 = std::min<int>((int *)&__range2,pvVar4);
        __range2._0_4_ = *piVar6;
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&__end2);
      }
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](u,(long)__range2._4_4_);
      if (*pvVar5 != (value_type)__range2) {
        local_a0 = (value_type)__range2;
        caps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             space.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_;
        while( true ) {
          bVar2 = false;
          if (caps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_ < (this->inst).nsizes) {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](u,(long)__range2._4_4_);
            bVar2 = *pvVar5 <= local_a0;
          }
          if (!bVar2) break;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (local_60,(long)caps.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                             );
          iVar3 = *pvVar4;
          pvVar8 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&this->weights,
                                (long)caps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage._4_4_);
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)__range2._4_4_);
          local_a0 = local_a0 - iVar3 * *pvVar4;
          caps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ =
               caps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._4_4_ + 1;
        }
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](u,(long)__range2._4_4_);
        if (local_a0 < *pvVar5) {
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&__range4);
          __end4 = std::vector<int,_std::allocator<int>_>::begin(valid_opts);
          cStack_d8 = std::vector<int,_std::allocator<int>_>::end(valid_opts);
          while (bVar2 = __gnu_cxx::operator!=(&__end4,&stack0xffffffffffffff28), bVar2) {
            piVar7 = __gnu_cxx::
                     __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end4);
            local_dc = *piVar7;
            pvVar8 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&(this->inst).Ws,(long)local_dc);
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar8,(long)__range2._4_4_)
            ;
            iVar3 = *pvVar4;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](u,(long)__range2._4_4_);
            local_e0 = iVar3 - *pvVar5;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&__range4,&local_e0);
            __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
            operator++(&__end4);
          }
          sVar9 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)&__range4);
          if (1 < sVar9) {
            local_e8._M_current =
                 (int *)std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)&__range4);
            local_f0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                        ((vector<int,_std::allocator<int>_> *)&__range4);
            std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      (local_e8,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                                local_f0);
            local_108._M_current =
                 (int *)std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)&__range4);
            local_110 = (int *)std::vector<int,_std::allocator<int>_>::end
                                         ((vector<int,_std::allocator<int>_> *)&__range4);
            local_100 = std::
                        unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                                  (local_108,
                                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    )local_110);
            __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
            __normal_iterator<int*>
                      ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)
                       &local_f8,&local_100);
            local_120._M_current =
                 (int *)std::vector<int,_std::allocator<int>_>::end
                                  ((vector<int,_std::allocator<int>_> *)&__range4);
            __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
            __normal_iterator<int*>
                      ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)
                       &local_118,&local_120);
            std::vector<int,_std::allocator<int>_>::erase
                      ((vector<int,_std::allocator<int>_> *)&__range4,local_f8,local_118);
          }
          iVar3 = min_slack(this,local_60,
                            space.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,__range2._4_4_,
                            (vector<int,_std::allocator<int>_> *)&__range4);
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](u,(long)__range2._4_4_);
          *pvVar5 = iVar3 + *pvVar5;
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)&__range4);
        }
        else {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](u,(long)__range2._4_4_);
          *pvVar5 = local_a0;
        }
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&minw);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  }
  return;
}

Assistant:

void Arcflow::lift_state(const std::vector<int> &valid_opts, std::vector<int> &u, int it,
						 int ic) const {
	if (it >= inst.nsizes) {
		return;
	}
	std::vector<int> space(inst.ndims);
	for (int d = 0; d < inst.ndims; d++) {
		space[d] = maxW[d] - u[d];
	}
	const std::vector<int> &r = count_max_rep(space, it, ic);
	for (int d = 0; d < inst.ndims; d++) {
		int minw = maxW[d];
		for (int t : valid_opts) {
			minw = std::min(minw, inst.Ws[t][d]);
		}
		if (u[d] != minw) {
			// lift method 1
			int maxpos = minw;
			for (int i = it; i < inst.nsizes && maxpos >= u[d]; i++) {
				maxpos -= r[i] * weights[i][d];
			}
			if (maxpos >= u[d]) {
				u[d] = maxpos;
			} else {
				// lift method 2
				std::vector<int> caps;
				for (int t : valid_opts) {
					caps.push_back(inst.Ws[t][d] - u[d]);
				}
				if (caps.size() > 1) {
					sort(all(caps));
					caps.erase(unique(all(caps)), caps.end());
				}
				u[d] += min_slack(r, it, d, caps);
			}
		}
	}
}